

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

Datatype * __thiscall TypeOpCpoolref::getOutputLocal(TypeOpCpoolref *this,PcodeOp *op)

{
  int iVar1;
  pointer ppVVar2;
  undefined4 extraout_var;
  Datatype *pDVar4;
  pointer ppVVar5;
  type_metatype m;
  int4 s;
  long lVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> refs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  uintb local_30;
  int *piVar3;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar5 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (1 < (int)((ulong)((long)ppVVar5 - (long)ppVVar2) >> 3)) {
    lVar6 = 1;
    do {
      local_30 = (ppVVar2[lVar6]->loc).offset;
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_30);
        ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppVVar5 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_30;
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)((long)ppVVar5 - (long)ppVVar2) >> 3));
  }
  iVar1 = (*this->cpool->_vptr_ConstantPool[3])(this->cpool,&local_48);
  piVar3 = (int *)CONCAT44(extraout_var,iVar1);
  if (piVar3 == (int *)0x0) {
    s = op->output->size;
    m = TYPE_UNKNOWN;
  }
  else {
    if (*piVar3 != 6) {
      pDVar4 = *(Datatype **)(piVar3 + 0xc);
      goto LAB_002442e0;
    }
    m = TYPE_BOOL;
    s = 1;
  }
  pDVar4 = TypeFactory::getBase((this->super_TypeOp).tlst,s,m);
LAB_002442e0:
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pDVar4;
}

Assistant:

Datatype *TypeOpCpoolref::getOutputLocal(const PcodeOp *op) const

{
  vector<uintb> refs;
  for(int4 i=1;i<op->numInput();++i)
    refs.push_back(op->getIn(i)->getOffset());
  const CPoolRecord *rec = cpool->getRecord(refs);
  if (rec == (const CPoolRecord *)0)
    return TypeOp::getOutputLocal(op);
  if (rec->getTag() == CPoolRecord::instance_of)
    return tlst->getBase(1,TYPE_BOOL);
  return rec->getType();
}